

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOArrayLengthTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::SSBOArrayLengthTests::init(SSBOArrayLengthTests *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  undefined4 uVar2;
  Context *pCVar3;
  long *plVar4;
  TestNode *node;
  undefined8 in_RCX;
  long *plVar5;
  ulong *puVar6;
  undefined8 uVar7;
  long lVar8;
  string desc;
  string name;
  long *local_e8;
  long local_e0;
  long local_d8;
  long lStack_d0;
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  ulong *local_a8;
  long local_a0;
  ulong local_98;
  long lStack_90;
  uint local_84;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  char *local_38;
  
  uVar7 = CONCAT71((int7)((ulong)in_RCX >> 8),1);
  lVar8 = 0;
  do {
    local_84 = (uint)uVar7;
    bVar1 = ::glcts::fixed_sample_locations_values[lVar8];
    local_38 = "unsized_";
    if (bVar1 != false) {
      local_38 = "sized_";
    }
    local_40 = "unsized ";
    if (bVar1 != false) {
      local_40 = "sized ";
    }
    lVar8 = 8;
    do {
      local_a0 = 0;
      local_98 = local_98 & 0xffffffffffffff00;
      local_a8 = &local_98;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_b8 = *plVar5;
        lStack_b0 = plVar4[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar5;
        local_c8 = (long *)*plVar4;
      }
      local_c0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = &local_d8;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_d8 = *plVar5;
        lStack_d0 = plVar4[3];
      }
      else {
        local_d8 = *plVar5;
        local_e8 = (long *)*plVar4;
      }
      local_e0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_e8);
      local_80 = &local_70;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_70 = *plVar5;
        lStack_68 = plVar4[3];
      }
      else {
        local_70 = *plVar5;
        local_80 = (long *)*plVar4;
      }
      local_78 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"Test length() of ","");
      plVar4 = (long *)std::__cxx11::string::append((char *)local_60);
      puVar6 = (ulong *)(plVar4 + 2);
      if ((ulong *)*plVar4 == puVar6) {
        local_98 = *puVar6;
        lStack_90 = plVar4[3];
        local_a8 = &local_98;
      }
      else {
        local_98 = *puVar6;
        local_a8 = (ulong *)*plVar4;
      }
      local_a0 = plVar4[1];
      *plVar4 = (long)puVar6;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_b8 = *plVar5;
        lStack_b0 = plVar4[3];
        local_c8 = &local_b8;
      }
      else {
        local_b8 = *plVar5;
        local_c8 = (long *)*plVar4;
      }
      local_c0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      plVar4 = (long *)std::__cxx11::string::append((char *)&local_c8);
      local_e8 = &local_d8;
      plVar5 = plVar4 + 2;
      if ((long *)*plVar4 == plVar5) {
        local_d8 = *plVar5;
        lStack_d0 = plVar4[3];
      }
      else {
        local_d8 = *plVar5;
        local_e8 = (long *)*plVar4;
      }
      local_e0 = plVar4[1];
      *plVar4 = (long)plVar5;
      plVar4[1] = 0;
      *(undefined1 *)(plVar4 + 2) = 0;
      if (local_c8 != &local_b8) {
        operator_delete(local_c8,local_b8 + 1);
      }
      if (local_a8 != &local_98) {
        operator_delete(local_a8,local_98 + 1);
      }
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      node = (TestNode *)operator_new(0x90);
      pCVar3 = (this->super_TestCaseGroup).m_context;
      uVar2 = *(undefined4 *)(&UNK_02163ba8 + lVar8);
      tcu::TestCase::TestCase((TestCase *)node,pCVar3->m_testCtx,(char *)local_80,(char *)local_e8);
      node[1]._vptr_TestNode = (_func_int **)pCVar3;
      node->_vptr_TestNode = (_func_int **)&PTR__SSBOArrayLengthCase_02163c20;
      *(undefined4 *)&node[1].m_testCtx = uVar2;
      *(bool *)((long)&node[1].m_testCtx + 4) = bVar1;
      node[1].m_name._M_dataplus._M_p = (pointer)0x0;
      node[1].m_name._M_string_length = 0;
      tcu::TestNode::addChild((TestNode *)this,node);
      if (local_e8 != &local_d8) {
        operator_delete(local_e8,local_d8 + 1);
      }
      if (local_80 != &local_70) {
        operator_delete(local_80,local_70 + 1);
      }
      lVar8 = lVar8 + 0x18;
    } while (lVar8 != 0x50);
    lVar8 = 1;
    uVar7 = 0;
  } while ((local_84 & 1) != 0);
  return 1;
}

Assistant:

void SSBOArrayLengthTests::init (void)
{
	static const struct Qualifier
	{
		SSBOArrayLengthCase::ArrayAccess	access;
		const char*							name;
		const char*							desc;
	}  qualifiers[] =
	{
		{ SSBOArrayLengthCase::ACCESS_DEFAULT,		"",				""			},
		{ SSBOArrayLengthCase::ACCESS_WRITEONLY,	"writeonly_",	"writeonly"	},
		{ SSBOArrayLengthCase::ACCESS_READONLY,		"readonly_",	"readonly"	},
	};

	static const bool arraysSized[]	= { true, false };

	for (int sizeNdx = 0; sizeNdx < DE_LENGTH_OF_ARRAY(arraysSized); ++sizeNdx)
	for (int qualifierNdx = 0; qualifierNdx < DE_LENGTH_OF_ARRAY(qualifiers); ++qualifierNdx)
	{
		const std::string name = std::string() + ((arraysSized[sizeNdx]) ? ("sized_") : ("unsized_")) + qualifiers[qualifierNdx].name + "array";
		const std::string desc = std::string("Test length() of ") + ((arraysSized[sizeNdx]) ? ("sized ") : ("unsized ")) + qualifiers[qualifierNdx].name + " array";

		this->addChild(new SSBOArrayLengthCase(m_context, name.c_str(), desc.c_str(), qualifiers[qualifierNdx].access, arraysSized[sizeNdx]));
	}
}